

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void chunk(LexState *ls)

{
  Token *pTVar1;
  Token *pTVar2;
  SemInfo *seminfo;
  int *l1;
  unsigned_short *puVar3;
  lu_byte lVar4;
  FuncState *pFVar5;
  Instruction *pIVar6;
  LocVar *pLVar7;
  SemInfo SVar8;
  undefined4 uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  TString *pTVar14;
  TString *pTVar15;
  byte bVar16;
  uint uVar17;
  uint uVar18;
  FuncState *pFVar19;
  ulong uVar20;
  ulong uVar21;
  expdesc v;
  expdesc b;
  undefined1 local_80 [8];
  expdesc local_78;
  int local_5c;
  expdesc local_58;
  FuncState *local_40;
  FuncState *local_38;
  
  uVar17 = *(int *)&ls->L->nCcalls + 1;
  ls->L->nCcalls = (unsigned_short)uVar17;
  if (200 < (uVar17 & 0xffff)) {
    luaX_lexerror(ls,"chunk has too many syntax levels",0);
  }
  pTVar1 = &ls->t;
  pTVar2 = &ls->lookahead;
  seminfo = &(ls->t).seminfo;
  do {
    iVar10 = pTVar1->token;
    if ((iVar10 - 0x104U < 0x1c) && ((0x8010007U >> (iVar10 - 0x104U & 0x1f) & 1) != 0))
    goto LAB_0010c162;
    if (iVar10 - 0x102U < 0x14) {
      iVar12 = ls->linenumber;
      switch(iVar10) {
      case 0x102:
        ls->lastline = iVar12;
        if ((ls->lookahead).token == 0x11f) {
          iVar10 = llex(ls,seminfo);
          (ls->t).token = iVar10;
        }
        else {
          uVar9 = *(undefined4 *)&pTVar2->field_0x4;
          SVar8 = (ls->lookahead).seminfo;
          pTVar1->token = pTVar2->token;
          *(undefined4 *)&pTVar1->field_0x4 = uVar9;
          (ls->t).seminfo = SVar8;
          pTVar2->token = 0x11f;
        }
        breakstat(ls);
LAB_0010c14a:
        testnext(ls,0x3b);
        ls->fs->freereg = (uint)ls->fs->nactvar;
LAB_0010c162:
        puVar3 = &ls->L->nCcalls;
        *puVar3 = *puVar3 - 1;
        return;
      case 0x103:
        ls->lastline = iVar12;
        if ((ls->lookahead).token == 0x11f) {
          iVar10 = llex(ls,seminfo);
          (ls->t).token = iVar10;
        }
        else {
          uVar9 = *(undefined4 *)&pTVar2->field_0x4;
          SVar8 = (ls->lookahead).seminfo;
          pTVar1->token = pTVar2->token;
          *(undefined4 *)&pTVar1->field_0x4 = uVar9;
          (ls->t).seminfo = SVar8;
          pTVar2->token = 0x11f;
        }
        block(ls);
        check_match(ls,0x106,0x103,iVar12);
        break;
      default:
        goto switchD_0010b6e0_caseD_104;
      case 0x108:
        local_40 = ls->fs;
        local_58.u.s.info = -1;
        local_58.u.s.aux._0_1_ = local_40->nactvar;
        local_58.u.s.aux._1_2_ = 0x100;
        local_58._0_8_ = local_40->bl;
        local_40->bl = (BlockCnt *)&local_58;
        ls->lastline = iVar12;
        if ((ls->lookahead).token == 0x11f) {
          iVar10 = llex(ls,seminfo);
          (ls->t).token = iVar10;
        }
        else {
          uVar9 = *(undefined4 *)&pTVar2->field_0x4;
          SVar8 = (ls->lookahead).seminfo;
          pTVar1->token = pTVar2->token;
          *(undefined4 *)&pTVar1->field_0x4 = uVar9;
          (ls->t).seminfo = SVar8;
          pTVar2->token = 0x11f;
        }
        pTVar14 = str_checkname(ls);
        iVar10 = (ls->t).token;
        if ((iVar10 == 0x2c) || (iVar10 == 0x10b)) {
          local_38 = ls->fs;
          local_5c = local_38->freereg;
          pTVar15 = luaX_newstring(ls,"(for generator)",0xf);
          new_localvar(ls,pTVar15,0);
          pTVar15 = luaX_newstring(ls,"(for state)",0xb);
          iVar13 = 1;
          new_localvar(ls,pTVar15,1);
          pTVar15 = luaX_newstring(ls,"(for control)",0xd);
          new_localvar(ls,pTVar15,2);
          new_localvar(ls,pTVar14,3);
          iVar10 = testnext(ls,0x2c);
          if (iVar10 != 0) {
            iVar10 = 4;
            do {
              iVar13 = iVar10;
              pTVar14 = str_checkname(ls);
              new_localvar(ls,pTVar14,iVar13);
              iVar11 = testnext(ls,0x2c);
              iVar10 = iVar13 + 1;
            } while (iVar11 != 0);
            iVar13 = iVar13 + -2;
          }
          checknext(ls,0x10b);
          iVar10 = ls->linenumber;
          iVar11 = explist1(ls,(expdesc *)local_80);
          adjust_assign((LexState *)ls->fs,3,iVar11,(expdesc *)local_80);
          luaK_checkstack(local_38,3);
          forbody(ls,local_5c,iVar10,iVar13,0);
        }
        else {
          if (iVar10 != 0x3d) {
            luaX_lexerror(ls,"\'=\' or \'in\' expected",iVar10);
          }
          pFVar5 = ls->fs;
          local_5c = pFVar5->freereg;
          pTVar15 = luaX_newstring(ls,"(for index)",0xb);
          new_localvar(ls,pTVar15,0);
          pTVar15 = luaX_newstring(ls,"(for limit)",0xb);
          new_localvar(ls,pTVar15,1);
          pTVar15 = luaX_newstring(ls,"(for step)",10);
          new_localvar(ls,pTVar15,2);
          new_localvar(ls,pTVar14,3);
          checknext(ls,0x3d);
          subexpr(ls,(expdesc *)local_80,0);
          luaK_exp2nextreg(ls->fs,(expdesc *)local_80);
          checknext(ls,0x2c);
          subexpr(ls,(expdesc *)local_80,0);
          luaK_exp2nextreg(ls->fs,(expdesc *)local_80);
          iVar10 = testnext(ls,0x2c);
          if (iVar10 == 0) {
            iVar10 = pFVar5->freereg;
            local_80 = (undefined1  [8])0x3ff0000000000000;
            local_78.k = VFALSE;
            iVar13 = addk(pFVar5,(TValue *)local_80,(TValue *)local_80);
            luaK_code(pFVar5,(iVar10 << 6 | iVar13 << 0xe) + 1,pFVar5->ls->lastline);
            luaK_checkstack(pFVar5,1);
            pFVar5->freereg = pFVar5->freereg + 1;
          }
          else {
            subexpr(ls,(expdesc *)local_80,0);
            luaK_exp2nextreg(ls->fs,(expdesc *)local_80);
          }
          forbody(ls,local_5c,iVar12,1,1);
        }
        check_match(ls,0x106,0x108,iVar12);
        leaveblock(local_40);
        break;
      case 0x109:
        ls->lastline = iVar12;
        if ((ls->lookahead).token == 0x11f) {
          iVar10 = llex(ls,seminfo);
          (ls->t).token = iVar10;
        }
        else {
          uVar9 = *(undefined4 *)&pTVar2->field_0x4;
          SVar8 = (ls->lookahead).seminfo;
          pTVar1->token = pTVar2->token;
          *(undefined4 *)&pTVar1->field_0x4 = uVar9;
          (ls->t).seminfo = SVar8;
          pTVar2->token = 0x11f;
        }
        singlevar(ls,(expdesc *)local_80);
        while (iVar10 = pTVar1->token, iVar10 == 0x2e) {
          field(ls,(expdesc *)local_80);
        }
        if (iVar10 == 0x3a) {
          field(ls,(expdesc *)local_80);
        }
        body(ls,&local_58,(uint)(iVar10 == 0x3a),iVar12);
        luaK_storevar(ls->fs,(expdesc *)local_80,&local_58);
        ls->fs->f->lineinfo[(long)ls->fs->pc + -1] = iVar12;
        break;
      case 0x10a:
        pFVar5 = ls->fs;
        local_80._0_4_ = 0xffffffff;
        iVar10 = test_then_block(ls);
        l1 = &pFVar5->jpc;
        while (pTVar1->token == 0x105) {
          iVar13 = luaK_jump(pFVar5);
          luaK_concat(pFVar5,(int *)local_80,iVar13);
          pFVar5->lasttarget = pFVar5->pc;
          luaK_concat(pFVar5,l1,iVar10);
          iVar10 = test_then_block(ls);
        }
        if (pTVar1->token == 0x104) {
          iVar13 = luaK_jump(pFVar5);
          luaK_concat(pFVar5,(int *)local_80,iVar13);
          pFVar5->lasttarget = pFVar5->pc;
          luaK_concat(pFVar5,l1,iVar10);
          iVar10 = (ls->lookahead).token;
          ls->lastline = ls->linenumber;
          if (iVar10 == 0x11f) {
            iVar10 = llex(ls,seminfo);
            (ls->t).token = iVar10;
          }
          else {
            uVar9 = *(undefined4 *)&pTVar2->field_0x4;
            SVar8 = (ls->lookahead).seminfo;
            pTVar1->token = pTVar2->token;
            *(undefined4 *)&pTVar1->field_0x4 = uVar9;
            (ls->t).seminfo = SVar8;
            pTVar2->token = 0x11f;
          }
          block(ls);
        }
        else {
          luaK_concat(pFVar5,(int *)local_80,iVar10);
        }
        pFVar5->lasttarget = pFVar5->pc;
        luaK_concat(pFVar5,l1,local_80._0_4_);
        check_match(ls,0x106,0x10a,iVar12);
        break;
      case 0x10c:
        ls->lastline = iVar12;
        if ((ls->lookahead).token == 0x11f) {
          iVar10 = llex(ls,seminfo);
          (ls->t).token = iVar10;
        }
        else {
          uVar9 = *(undefined4 *)&pTVar2->field_0x4;
          SVar8 = (ls->lookahead).seminfo;
          pTVar1->token = pTVar2->token;
          *(undefined4 *)&pTVar1->field_0x4 = uVar9;
          (ls->t).seminfo = SVar8;
          pTVar2->token = 0x11f;
        }
        iVar10 = testnext(ls,0x109);
        if (iVar10 == 0) {
          uVar21 = 0;
          do {
            uVar20 = uVar21;
            pTVar14 = str_checkname(ls);
            new_localvar(ls,pTVar14,(int)uVar20);
            iVar10 = testnext(ls,0x2c);
            uVar21 = uVar20 + 1;
          } while (iVar10 != 0);
          iVar10 = testnext(ls,0x3d);
          if (iVar10 == 0) {
            local_80 = (undefined1  [8])((ulong)local_80 & 0xffffffff00000000);
            iVar10 = 0;
          }
          else {
            iVar10 = explist1(ls,(expdesc *)local_80);
          }
          adjust_assign((LexState *)ls->fs,(int)uVar21,iVar10,(expdesc *)local_80);
          pFVar5 = ls->fs;
          lVar4 = pFVar5->nactvar;
          pFVar5->nactvar = lVar4 + (char)uVar21;
          iVar10 = pFVar5->pc;
          pLVar7 = pFVar5->f->locvars;
          uVar20 = ~uVar20;
          do {
            pLVar7[pFVar5->actvar[(byte)((char)uVar21 + lVar4) + uVar20]].startpc = iVar10;
            uVar20 = uVar20 + 1;
          } while (uVar20 != 0);
        }
        else {
          pFVar5 = ls->fs;
          pTVar14 = str_checkname(ls);
          new_localvar(ls,pTVar14,0);
          local_78.k = pFVar5->freereg;
          local_78.u.nval = -NAN;
          local_80._0_4_ = 6;
          luaK_checkstack(pFVar5,1);
          pFVar5->freereg = pFVar5->freereg + 1;
          pFVar19 = ls->fs;
          bVar16 = pFVar19->nactvar + 1;
          pFVar19->nactvar = bVar16;
          pFVar19->f->locvars[*(ushort *)&pFVar19->upvalues[(ulong)bVar16 + 0x3b].info].startpc =
               pFVar19->pc;
          body(ls,&local_58,0,ls->linenumber);
          luaK_storevar(pFVar5,(expdesc *)local_80,&local_58);
          pFVar5->f->locvars[*(ushort *)&pFVar5->upvalues[(ulong)pFVar5->nactvar + 0x3b].info].
          startpc = pFVar5->pc;
        }
        break;
      case 0x110:
        pFVar5 = ls->fs;
        iVar10 = pFVar5->pc;
        pFVar5->lasttarget = iVar10;
        local_78.k = ~VVOID;
        local_78._6_1_ = 1;
        local_78._4_1_ = pFVar5->nactvar;
        local_78._5_1_ = 0;
        local_80 = (undefined1  [8])pFVar5->bl;
        local_58.u.s.info = -1;
        local_58.u.s.aux._1_2_ = 0;
        pFVar5->bl = (BlockCnt *)&local_58;
        ls->lastline = iVar12;
        local_58._0_8_ = (LHS_assign *)local_80;
        local_58.u.s.aux._0_1_ = local_78._4_1_;
        if ((ls->lookahead).token == 0x11f) {
          iVar13 = llex(ls,seminfo);
          (ls->t).token = iVar13;
        }
        else {
          uVar9 = *(undefined4 *)&pTVar2->field_0x4;
          SVar8 = (ls->lookahead).seminfo;
          pTVar1->token = pTVar2->token;
          *(undefined4 *)&pTVar1->field_0x4 = uVar9;
          (ls->t).seminfo = SVar8;
          pTVar2->token = 0x11f;
        }
        chunk(ls);
        check_match(ls,0x114,0x110,iVar12);
        iVar12 = cond(ls);
        if (local_58.u.s.aux._1_1_ == '\0') {
          leaveblock(pFVar5);
          pFVar19 = ls->fs;
        }
        else {
          breakstat(ls);
          pFVar19 = ls->fs;
          pFVar19->lasttarget = pFVar19->pc;
          luaK_concat(pFVar19,&pFVar19->jpc,iVar12);
          leaveblock(pFVar5);
          pFVar19 = ls->fs;
          iVar12 = luaK_jump(pFVar5);
        }
        luaK_patchlist(pFVar19,iVar12,iVar10);
        leaveblock(pFVar5);
        break;
      case 0x111:
        pFVar5 = ls->fs;
        ls->lastline = iVar12;
        if ((ls->lookahead).token == 0x11f) {
          iVar10 = llex(ls,seminfo);
          (ls->t).token = iVar10;
        }
        else {
          uVar9 = *(undefined4 *)&pTVar2->field_0x4;
          SVar8 = (ls->lookahead).seminfo;
          pTVar1->token = pTVar2->token;
          *(undefined4 *)&pTVar1->field_0x4 = uVar9;
          (ls->t).seminfo = SVar8;
          pTVar2->token = 0x11f;
          iVar10 = pTVar1->token;
        }
        uVar18 = 0x80001e;
        uVar17 = 0;
        if (((0x1b < iVar10 - 0x104U) || ((0x8010007U >> (iVar10 - 0x104U & 0x1f) & 1) == 0)) &&
           (iVar10 != 0x3b)) {
          iVar10 = explist1(ls,(expdesc *)local_80);
          if (local_80._0_4_ - VCALL < 2) {
            luaK_setreturns(pFVar5,(expdesc *)local_80,-1);
            if (iVar10 == 1 && local_80._0_4_ == VCALL) {
              pIVar6 = pFVar5->f->code;
              pIVar6[(int)local_78.k] = pIVar6[(int)local_78.k] & 0xffffffc0 | 0x1d;
            }
            uVar17 = (uint)pFVar5->nactvar;
            uVar18 = 0x1e;
          }
          else if (iVar10 == 1) {
            uVar17 = luaK_exp2anyreg(pFVar5,(expdesc *)local_80);
            uVar18 = 0x100001e;
          }
          else {
            luaK_exp2nextreg(pFVar5,(expdesc *)local_80);
            uVar17 = (uint)pFVar5->nactvar;
            uVar18 = iVar10 * 0x800000 + 0x80001e;
          }
        }
        luaK_code(pFVar5,uVar17 << 6 | uVar18,pFVar5->ls->lastline);
        goto LAB_0010c14a;
      case 0x115:
        pFVar5 = ls->fs;
        ls->lastline = iVar12;
        if ((ls->lookahead).token == 0x11f) {
          iVar10 = llex(ls,seminfo);
          (ls->t).token = iVar10;
        }
        else {
          uVar9 = *(undefined4 *)&pTVar2->field_0x4;
          SVar8 = (ls->lookahead).seminfo;
          pTVar1->token = pTVar2->token;
          *(undefined4 *)&pTVar1->field_0x4 = uVar9;
          (ls->t).seminfo = SVar8;
          pTVar2->token = 0x11f;
        }
        iVar10 = pFVar5->pc;
        pFVar5->lasttarget = iVar10;
        iVar13 = cond(ls);
        local_40 = (FuncState *)CONCAT44(local_40._4_4_,iVar13);
        local_78.k = ~VVOID;
        local_78._6_1_ = 1;
        local_78._4_1_ = pFVar5->nactvar;
        local_78._5_1_ = 0;
        local_80 = (undefined1  [8])pFVar5->bl;
        pFVar5->bl = (BlockCnt *)local_80;
        checknext(ls,0x103);
        block(ls);
        iVar13 = luaK_jump(pFVar5);
        luaK_patchlist(pFVar5,iVar13,iVar10);
        check_match(ls,0x106,0x115,iVar12);
        leaveblock(pFVar5);
        pFVar5->lasttarget = pFVar5->pc;
        luaK_concat(pFVar5,&pFVar5->jpc,(int)local_40);
      }
    }
    else {
switchD_0010b6e0_caseD_104:
      pFVar5 = ls->fs;
      primaryexp(ls,&local_78);
      if (local_78.k == VCALL) {
        pIVar6 = pFVar5->f->code;
        pIVar6[local_78.u.s.info] = pIVar6[local_78.u.s.info] & 0xff803fff | 0x4000;
      }
      else {
        local_80 = (undefined1  [8])0x0;
        assignment(ls,(LHS_assign *)local_80,1);
      }
    }
    testnext(ls,0x3b);
    ls->fs->freereg = (uint)ls->fs->nactvar;
  } while( true );
}

Assistant:

static void chunk(LexState*ls){
int islast=0;
enterlevel(ls);
while(!islast&&!block_follow(ls->t.token)){
islast=statement(ls);
testnext(ls,';');
ls->fs->freereg=ls->fs->nactvar;
}
leavelevel(ls);
}